

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O1

void av1_calc_indices_dim2_c
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *dist,int n,int k)

{
  int dist_1;
  int iVar1;
  int dist_2;
  int iVar2;
  ulong uVar3;
  int i_1;
  int i;
  long lVar4;
  ulong uVar5;
  int16_t *piVar6;
  
  if (dist != (int64_t *)0x0) {
    *dist = 0;
  }
  if (0 < n) {
    uVar3 = 0;
    do {
      lVar4 = 0;
      iVar1 = 0;
      do {
        iVar1 = iVar1 + ((int)data[lVar4] - (int)centroids[lVar4]) *
                        ((int)data[lVar4] - (int)centroids[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      indices[uVar3] = '\0';
      if (1 < k) {
        uVar5 = 1;
        piVar6 = centroids + 2;
        do {
          lVar4 = 0;
          iVar2 = 0;
          do {
            iVar2 = iVar2 + ((int)data[lVar4] - (int)piVar6[lVar4]) *
                            ((int)data[lVar4] - (int)piVar6[lVar4]);
            lVar4 = lVar4 + 1;
          } while (lVar4 == 1);
          if (iVar2 < iVar1) {
            indices[uVar3] = (uint8_t)uVar5;
            iVar1 = iVar2;
          }
          uVar5 = uVar5 + 1;
          piVar6 = piVar6 + 2;
        } while (uVar5 != (uint)k);
      }
      if (dist != (int64_t *)0x0) {
        *dist = *dist + (long)iVar1;
      }
      uVar3 = uVar3 + 1;
      data = data + 2;
    } while (uVar3 != (uint)n);
  }
  return;
}

Assistant:

void RENAME_C(av1_calc_indices)(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *dist, int n, int k) {
  if (dist) {
    *dist = 0;
  }
  for (int i = 0; i < n; ++i) {
    int min_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM, centroids);
    indices[i] = 0;
    for (int j = 1; j < k; ++j) {
      const int this_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM,
                                              centroids + j * AV1_K_MEANS_DIM);
      if (this_dist < min_dist) {
        min_dist = this_dist;
        indices[i] = j;
      }
    }
    if (dist) {
#if AV1_K_MEANS_DIM == 1
      *dist += min_dist * min_dist;
#else
      *dist += min_dist;
#endif
    }
  }
}